

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O0

void linearize_test_cond(Proc *proc,AstNode *node,BasicBlock *true_block,BasicBlock *false_block)

{
  Pseudo *condition_pseudo_00;
  Pseudo *condition_pseudo;
  BasicBlock *false_block_local;
  BasicBlock *true_block_local;
  AstNode *node_local;
  Proc *proc_local;
  
  condition_pseudo_00 = linearize_expression(proc,(node->field_2).function_stmt.name);
  instruct_cbr(proc,condition_pseudo_00,true_block,false_block,node->line_number);
  if (((undefined1  [48])*condition_pseudo_00 & (undefined1  [48])0xf) == (undefined1  [48])0xc) {
    free_temp_pseudo(proc,condition_pseudo_00,false);
    free_temp_pseudo(proc,(condition_pseudo_00->field_3).range_pseudo,false);
  }
  else {
    free_temp_pseudo(proc,condition_pseudo_00,false);
  }
  return;
}

Assistant:

static void linearize_test_cond(Proc *proc, AstNode *node, BasicBlock *true_block,
				BasicBlock *false_block)
{
	Pseudo *condition_pseudo = linearize_expression(proc, node->test_then_block.condition);
	instruct_cbr(proc, condition_pseudo, true_block, false_block, node->line_number);
	if (condition_pseudo->type == PSEUDO_RANGE_SELECT) {
		free_temp_pseudo(proc, condition_pseudo, false);
		free_temp_pseudo(proc, condition_pseudo->range_pseudo, false);
	}
	else
		free_temp_pseudo(proc, condition_pseudo, false);
}